

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O3

char * alboolString(ALCboolean x)

{
  char *pcVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  iVar2 = (int)CONCAT71(in_register_00000039,x);
  if (iVar2 == 1) {
    return "AL_TRUE";
  }
  if (iVar2 == 0) {
    return "AL_FALSE";
  }
  pcVar1 = sprintf_alloc("0x%X",(ulong)(uint)(int)x);
  return pcVar1;
}

Assistant:

const char *alboolString(const ALCboolean x)
{
    switch (x) {
        case AL_TRUE: return "AL_TRUE";
        case AL_FALSE: return "AL_FALSE";
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}